

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void avg_nmv(nmv_context *nmv_left,nmv_context *nmv_tr,int wt_left,int wt_tr)

{
  int in_ECX;
  int in_EDX;
  aom_cdf_prob *in_RSI;
  aom_cdf_prob *in_RDI;
  int num_cdfs_8;
  int array_size_8;
  aom_cdf_prob *cdf_ptr_tr_8;
  aom_cdf_prob *cdf_ptr_left_8;
  int num_cdfs_7;
  int array_size_7;
  aom_cdf_prob *cdf_ptr_tr_7;
  aom_cdf_prob *cdf_ptr_left_7;
  int num_cdfs_6;
  int array_size_6;
  aom_cdf_prob *cdf_ptr_tr_6;
  aom_cdf_prob *cdf_ptr_left_6;
  int num_cdfs_5;
  int array_size_5;
  aom_cdf_prob *cdf_ptr_tr_5;
  aom_cdf_prob *cdf_ptr_left_5;
  int num_cdfs_4;
  int array_size_4;
  aom_cdf_prob *cdf_ptr_tr_4;
  aom_cdf_prob *cdf_ptr_left_4;
  int num_cdfs_3;
  int array_size_3;
  aom_cdf_prob *cdf_ptr_tr_3;
  aom_cdf_prob *cdf_ptr_left_3;
  int num_cdfs_2;
  int array_size_2;
  aom_cdf_prob *cdf_ptr_tr_2;
  aom_cdf_prob *cdf_ptr_left_2;
  int num_cdfs_1;
  int array_size_1;
  aom_cdf_prob *cdf_ptr_tr_1;
  aom_cdf_prob *cdf_ptr_left_1;
  int i;
  int num_cdfs;
  int array_size;
  aom_cdf_prob *cdf_ptr_tr;
  aom_cdf_prob *cdf_ptr_left;
  int local_34;
  
  avg_cdf_symbol(in_RDI,in_RSI,1,5,4,in_EDX,in_ECX);
  for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
    avg_cdf_symbol(in_RDI + (long)local_34 * 0x45 + 5,in_RSI + (long)local_34 * 0x45 + 5,1,0xc,0xb,
                   in_EDX,in_ECX);
    avg_cdf_symbol(in_RDI + (long)local_34 * 0x45 + 0x11,in_RSI + (long)local_34 * 0x45 + 0x11,2,5,4
                   ,in_EDX,in_ECX);
    avg_cdf_symbol(in_RDI + (long)local_34 * 0x45 + 0x1b,in_RSI + (long)local_34 * 0x45 + 0x1b,1,5,4
                   ,in_EDX,in_ECX);
    avg_cdf_symbol(in_RDI + (long)local_34 * 0x45 + 0x20,in_RSI + (long)local_34 * 0x45 + 0x20,1,3,2
                   ,in_EDX,in_ECX);
    avg_cdf_symbol(in_RDI + (long)local_34 * 0x45 + 0x23,in_RSI + (long)local_34 * 0x45 + 0x23,1,3,2
                   ,in_EDX,in_ECX);
    avg_cdf_symbol(in_RDI + (long)local_34 * 0x45 + 0x26,in_RSI + (long)local_34 * 0x45 + 0x26,1,3,2
                   ,in_EDX,in_ECX);
    avg_cdf_symbol(in_RDI + (long)local_34 * 0x45 + 0x29,in_RSI + (long)local_34 * 0x45 + 0x29,1,3,2
                   ,in_EDX,in_ECX);
    avg_cdf_symbol(in_RDI + (long)local_34 * 0x45 + 0x2c,in_RSI + (long)local_34 * 0x45 + 0x2c,10,3,
                   2,in_EDX,in_ECX);
  }
  return;
}

Assistant:

static void avg_nmv(nmv_context *nmv_left, nmv_context *nmv_tr, int wt_left,
                    int wt_tr) {
  AVERAGE_CDF(nmv_left->joints_cdf, nmv_tr->joints_cdf, 4);
  for (int i = 0; i < 2; i++) {
    AVERAGE_CDF(nmv_left->comps[i].classes_cdf, nmv_tr->comps[i].classes_cdf,
                MV_CLASSES);
    AVERAGE_CDF(nmv_left->comps[i].class0_fp_cdf,
                nmv_tr->comps[i].class0_fp_cdf, MV_FP_SIZE);
    AVERAGE_CDF(nmv_left->comps[i].fp_cdf, nmv_tr->comps[i].fp_cdf, MV_FP_SIZE);
    AVERAGE_CDF(nmv_left->comps[i].sign_cdf, nmv_tr->comps[i].sign_cdf, 2);
    AVERAGE_CDF(nmv_left->comps[i].class0_hp_cdf,
                nmv_tr->comps[i].class0_hp_cdf, 2);
    AVERAGE_CDF(nmv_left->comps[i].hp_cdf, nmv_tr->comps[i].hp_cdf, 2);
    AVERAGE_CDF(nmv_left->comps[i].class0_cdf, nmv_tr->comps[i].class0_cdf,
                CLASS0_SIZE);
    AVERAGE_CDF(nmv_left->comps[i].bits_cdf, nmv_tr->comps[i].bits_cdf, 2);
  }
}